

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Try_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Try_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  const_reference pvVar1;
  pointer pAVar2;
  reference this_00;
  Dispatch_State *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Boxed_Value BVar4;
  eval_error *e;
  runtime_error *e_1;
  out_of_range *e_2;
  exception *e_3;
  Boxed_Value *e_4;
  undefined1 local_50 [40];
  Scope_Push_Pop spp;
  Dispatch_State *t_ss_local;
  Try_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this_local;
  Boxed_Value *retval;
  
  spp.m_ds._7_1_ = 0;
  Boxed_Value::Boxed_Value((Boxed_Value *)this);
  detail::Scope_Push_Pop::Scope_Push_Pop((Scope_Push_Pop *)(local_50 + 0x20),in_RDX);
  pvVar1 = Catch::clara::std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,0);
  pAVar2 = Catch::clara::std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
           ::operator->(pvVar1);
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_50,
             (Dispatch_State *)pAVar2);
  Boxed_Value::operator=((Boxed_Value *)this,(Boxed_Value *)local_50);
  Boxed_Value::~Boxed_Value((Boxed_Value *)local_50);
  pvVar1 = Catch::clara::std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
           ::back((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                   *)&t_ss[2].m_conversions);
  pAVar2 = Catch::clara::std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
           ::operator->(pvVar1);
  if ((pAVar2->super_AST_Node).identifier == Finally) {
    pvVar1 = Catch::clara::std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
             ::back((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                     *)&t_ss[2].m_conversions);
    pAVar2 = Catch::clara::std::
             unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
             ::operator->(pvVar1);
    this_00 = Catch::clara::std::
              vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
              ::operator[](&pAVar2->children,0);
    pAVar2 = Catch::clara::std::
             unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
             ::operator->(this_00);
    AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)&stack0xfffffffffffffeb8,
               (Dispatch_State *)pAVar2);
    Boxed_Value::operator=((Boxed_Value *)this,(Boxed_Value *)&stack0xfffffffffffffeb8);
    Boxed_Value::~Boxed_Value((Boxed_Value *)&stack0xfffffffffffffeb8);
  }
  spp.m_ds._7_1_ = 1;
  detail::Scope_Push_Pop::~Scope_Push_Pop((Scope_Push_Pop *)(local_50 + 0x20));
  _Var3._M_pi = extraout_RDX;
  if ((spp.m_ds._7_1_ & 1) == 0) {
    Boxed_Value::~Boxed_Value((Boxed_Value *)this);
    _Var3._M_pi = extraout_RDX_00;
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        Boxed_Value retval;

        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

        try {
          retval = this->children[0]->eval(t_ss);
        } catch (const exception::eval_error &e) {
          retval = handle_exception(t_ss, Boxed_Value(std::ref(e)));
        } catch (const std::runtime_error &e) {
          retval = handle_exception(t_ss, Boxed_Value(std::ref(e)));
        } catch (const std::out_of_range &e) {
          retval = handle_exception(t_ss, Boxed_Value(std::ref(e)));
        } catch (const std::exception &e) {
          retval = handle_exception(t_ss, Boxed_Value(std::ref(e)));
        } catch (Boxed_Value &e) {
          retval = handle_exception(t_ss, e);
        } catch (...) {
          if (this->children.back()->identifier == AST_Node_Type::Finally) {
            this->children.back()->children[0]->eval(t_ss);
          }
          throw;
        }

        if (this->children.back()->identifier == AST_Node_Type::Finally) {
          retval = this->children.back()->children[0]->eval(t_ss);
        }

        return retval;
      }